

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_dataproperties(_glist *x,t_scalar *sc,_binbuf *b)

{
  t_gobj **pptVar1;
  t_scalar *ptVar2;
  t_word tVar3;
  t_gobj **pptVar4;
  _gobj *p_Var5;
  _gobj *p_Var6;
  t_template *ptVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  _gobj **pp_Var11;
  int iVar12;
  t_scalar *x_00;
  t_gobj *ptVar13;
  t_gobj *x_01;
  
  glist_noselect(x);
  x_00 = (t_scalar *)0x0;
  iVar9 = -1;
  iVar12 = 0;
  pptVar1 = &x->gl_list;
  pptVar4 = pptVar1;
  while (ptVar2 = (t_scalar *)*pptVar4, ptVar2 != (t_scalar *)0x0) {
    if (ptVar2 == sc) {
      x_00 = ptVar2;
      iVar9 = iVar12;
    }
    iVar12 = iVar12 + 1;
    pptVar4 = &(ptVar2->sc_gobj).g_next;
  }
  if (iVar9 == -1) {
    pcVar10 = "data_properties: scalar disappeared";
  }
  else {
    if (b != (_binbuf *)0x0) {
      glist_readfrombinbuf(x,b,"properties dialog",0);
      x_01 = x->gl_list;
      if (iVar12 == 0) {
        gobj_vis(x_01,x,0);
        pp_Var11 = pptVar1;
      }
      else {
        do {
          ptVar13 = x_01;
          x_01 = ptVar13->g_next;
          if (x_01 == (t_gobj *)0x0) {
            pcVar10 = "couldn\'t update properties (perhaps a format problem?)";
            goto LAB_0014c74f;
          }
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        gobj_vis(x_01,x,0);
        pp_Var11 = &ptVar13->g_next;
      }
      *pp_Var11 = x_01->g_next;
      if (x_00 != (t_scalar *)0x0) {
        if ((((x_01->g_pd == scalar_class) && ((x_00->sc_gobj).g_pd == x_01->g_pd)) &&
            (x_01[1].g_pd == (t_pd)x_00->sc_template)) &&
           (ptVar7 = template_findbyname((t_symbol *)x_01[1].g_pd), ptVar7 != (t_template *)0x0)) {
          for (lVar8 = 0; lVar8 < ptVar7->t_n; lVar8 = lVar8 + 1) {
            tVar3 = *(t_word *)(&x_01[1].g_next + lVar8);
            *(t_word *)(&x_01[1].g_next + lVar8) = x_00->sc_vec[lVar8];
            x_00->sc_vec[lVar8] = tVar3;
          }
          pd_free(&x_01->g_pd);
          iVar9 = glist_isvisible(x);
          if (iVar9 != 0) {
            gobj_vis(&x_00->sc_gobj,x,0);
            gobj_vis(&x_00->sc_gobj,x,1);
            return;
          }
        }
        else {
          glist_delete(x,&x_00->sc_gobj);
          p_Var6 = x->gl_list;
          if (iVar9 < 1) {
            x_01->g_next = x->gl_list;
            *pptVar1 = x_01;
          }
          else {
            do {
              p_Var5 = p_Var6;
              if (p_Var5 == (_gobj *)0x0) {
                pcVar10 = "data_properties: can\'t reinsert";
                goto LAB_0014c791;
              }
              p_Var6 = p_Var5->g_next;
              iVar9 = iVar9 + -1;
              if (iVar9 == 0) goto LAB_0014c73e;
            } while (p_Var6 != (_gobj *)0x0);
            p_Var6 = (_gobj *)0x0;
LAB_0014c73e:
            x_01->g_next = p_Var6;
            p_Var5->g_next = x_01;
          }
        }
        return;
      }
      pcVar10 = "data_properties: couldn\'t find old element";
LAB_0014c791:
      bug(pcVar10);
      return;
    }
    pcVar10 = "couldn\'t update properties (none given)";
  }
LAB_0014c74f:
  pd_error(x,pcVar10);
  return;
}

Assistant:

void canvas_dataproperties(t_canvas *x, t_scalar *sc, t_binbuf *b)
{
    int ntotal, nnew, scindex;
    t_gobj *y, *y2 = 0, *newone, *oldone = 0;
    t_template *template;
    glist_noselect(x);
    for (y = x->gl_list, ntotal = 0, scindex = -1; y; y = y->g_next)
    {
        if (y == &sc->sc_gobj)
            scindex = ntotal, oldone = y;
        ntotal++;
    }

    if (scindex == -1)
    {
        pd_error(x, "data_properties: scalar disappeared");
        return;
    }
    if (!b) {
        pd_error(x, "couldn't update properties (none given)");
        return;
    }
    glist_readfrombinbuf(x, b, "properties dialog", 0);
    newone = 0;
        /* take the new object off the list */
    if (ntotal)
    {
        for (y = x->gl_list, nnew = 1; (y2 = y->g_next);
            y = y2, nnew++)
                if (nnew == ntotal)
        {
            newone = y2;
            gobj_vis(newone, x, 0);
            y->g_next = y2->g_next;
            break;
        }
    }
    else gobj_vis((newone = x->gl_list), x, 0), x->gl_list = newone->g_next;
    if (!newone)
        pd_error(x, "couldn't update properties (perhaps a format problem?)");
    else if (!oldone)
        bug("data_properties: couldn't find old element");
    else if (newone->g_pd == scalar_class && oldone->g_pd == scalar_class
        && ((t_scalar *)newone)->sc_template ==
            ((t_scalar *)oldone)->sc_template
        && (template = template_findbyname(((t_scalar *)newone)->sc_template)))
    {
            /* swap new one with old one; then delete new one */
        int i;
        for (i = 0; i < template->t_n; i++)
        {
            t_word w = ((t_scalar *)newone)->sc_vec[i];
            ((t_scalar *)newone)->sc_vec[i] = ((t_scalar *)oldone)->sc_vec[i];
            ((t_scalar *)oldone)->sc_vec[i] = w;
        }
        pd_free(&newone->g_pd);
        if (glist_isvisible(x))
        {
            gobj_vis(oldone, x, 0);
            gobj_vis(oldone, x, 1);
        }
    }
    else
    {
            /* delete old one; put new one where the old one was on glist */
        glist_delete(x, oldone);
        if (scindex > 0)
        {
            for (y = x->gl_list, nnew = 1; y;
                y = y->g_next, nnew++)
                    if (nnew == scindex || !y->g_next)
            {
                newone->g_next = y->g_next;
                y->g_next = newone;
                goto didit;
            }
            bug("data_properties: can't reinsert");
        }
        else newone->g_next = x->gl_list, x->gl_list = newone;
    }
didit:
    ;
}